

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O0

char * lookup_name(name_cache_conflict *cache,_func_char_ptr_name_cache_ptr_id_t *lookup_fn,id_t id)

{
  int iVar1;
  char *pcVar2;
  int slot;
  char *name;
  id_t id_local;
  _func_char_ptr_name_cache_ptr_id_t *lookup_fn_local;
  name_cache_conflict *cache_local;
  
  cache->probes = cache->probes + 1;
  iVar1 = (int)((ulong)id % cache->size);
  if (cache->cache[iVar1].name != (char *)0x0) {
    if (cache->cache[iVar1].id == id) {
      cache->hits = cache->hits + 1;
      if (cache->cache[iVar1].name == "(noname)") {
        return (char *)0x0;
      }
      return cache->cache[iVar1].name;
    }
    if (cache->cache[iVar1].name != "(noname)") {
      free(cache->cache[iVar1].name);
    }
    cache->cache[iVar1].name = (char *)0x0;
  }
  pcVar2 = (*lookup_fn)(cache,id);
  if (pcVar2 == (char *)0x0) {
    cache->cache[iVar1].name = "(noname)";
    cache->cache[iVar1].id = id;
    cache_local = (name_cache_conflict *)0x0;
  }
  else {
    cache->cache[iVar1].name = pcVar2;
    cache->cache[iVar1].id = id;
    cache_local = (name_cache_conflict *)cache->cache[iVar1].name;
  }
  return (char *)cache_local;
}

Assistant:

static const char *
lookup_name(struct name_cache *cache,
    const char * (*lookup_fn)(struct name_cache *, id_t), id_t id)
{
	const char *name;
	int slot;


	cache->probes++;

	slot = id % cache->size;
	if (cache->cache[slot].name != NULL) {
		if (cache->cache[slot].id == id) {
			cache->hits++;
			if (cache->cache[slot].name == NO_NAME)
				return (NULL);
			return (cache->cache[slot].name);
		}
		if (cache->cache[slot].name != NO_NAME)
			free((void *)(uintptr_t)cache->cache[slot].name);
		cache->cache[slot].name = NULL;
	}

	name = (lookup_fn)(cache, id);
	if (name == NULL) {
		/* Cache and return the negative response. */
		cache->cache[slot].name = NO_NAME;
		cache->cache[slot].id = id;
		return (NULL);
	}

	cache->cache[slot].name = name;
	cache->cache[slot].id = id;
	return (cache->cache[slot].name);
}